

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void labelfont_cb(Fl_Choice *i,void *v)

{
  bool bVar1;
  int f;
  int iVar2;
  Fl_Widget_Type *q;
  Fl_Type *o;
  int n_1;
  int mod;
  int n;
  void *v_local;
  Fl_Choice *i_local;
  
  if ((char *)v == "LOAD") {
    n_1 = Fl_Widget::labelfont(current_widget->o);
    if (0xf < n_1) {
      n_1 = 0;
    }
    Fl_Choice::value(i,n_1);
  }
  else {
    bVar1 = false;
    f = Fl_Choice::value(i);
    for (q = (Fl_Widget_Type *)Fl_Type::first; q != (Fl_Widget_Type *)0x0;
        q = (Fl_Widget_Type *)(q->super_Fl_Type).next) {
      if (((q->super_Fl_Type).selected != '\0') &&
         (iVar2 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar2 != 0)) {
        Fl_Widget::labelfont(q->o,f);
        Fl_Widget_Type::redraw(q);
        bVar1 = true;
      }
    }
    if (bVar1) {
      set_modflag(1);
    }
  }
  return;
}

Assistant:

void labelfont_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    int n = current_widget->o->labelfont();
    if (n > 15) n = 0;
    i->value(n);
  } else {
    int mod = 0;
    int n = i->value();
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->o->labelfont(n);
	q->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}